

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int cm_zlib_inflateEnd(z_streamp strm)

{
  internal_state *piVar1;
  long lVar2;
  int iVar3;
  inflate_state *state;
  z_streamp strm_local;
  
  iVar3 = inflateStateCheck(strm);
  if (iVar3 == 0) {
    piVar1 = strm->state;
    lVar2._0_1_ = piVar1->method;
    lVar2._1_3_ = *(undefined3 *)&piVar1->field_0x49;
    lVar2._4_4_ = piVar1->last_flush;
    if (lVar2 != 0) {
      (*strm->zfree)(strm->opaque,*(voidpf *)&piVar1->method);
    }
    (*strm->zfree)(strm->opaque,strm->state);
    strm->state = (internal_state *)0x0;
    strm_local._4_4_ = 0;
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateEnd(z_streamp strm) {
    struct inflate_state FAR *state;
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (state->window != Z_NULL) ZFREE(strm, state->window);
    ZFREE(strm, strm->state);
    strm->state = Z_NULL;
    Tracev((stderr, "inflate: end\n"));
    return Z_OK;
}